

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

void warning_report(string *message)

{
  ostream *poVar1;
  string *message_local;
  
  poVar1 = (ostream *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"WARNING!\t");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  warning_count = warning_count + 1;
  return;
}

Assistant:

void warning_report(std::string message)
{
	std::cerr << std::endl << "WARNING!\t" << message << std::endl;
	warning_count++;
}